

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CulturalFeatureAppearance.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::CulturalFeatureAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,CulturalFeatureAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cultural Feature Appearance:",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tDamage:                 ",0x1a);
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tSmoke Emanating:        ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFlaming Effect:         ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFrozen Status:          ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tInternal Heat:          ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tState:                  ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tExterior Lights:        ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tInterior Lights:        ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMasked/Cloaked:         ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString CulturalFeatureAppearance::GetAsString() const
{
  KStringStream ss;

  ss << "Cultural Feature Appearance:"
     << "\n\tDamage:                 " << GetEnumAsStringEntityDamage( m_Damage )
     << "\n\tSmoke Emanating:        " << m_Smoke
     << "\n\tFlaming Effect:         " << m_FlamingEffectField
     << "\n\tFrozen Status:          " << m_FrozenStatus
     << "\n\tInternal Heat:          " << m_InternalHeatStatus
     << "\n\tState:                  " << m_State
     << "\n\tExterior Lights:        " << m_InteriorLights
     << "\n\tInterior Lights:        " << m_InteriorLights
     << "\n\tMasked/Cloaked:         " << m_MaskedCloaked
     << "\n";

  return ss.str();
}